

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator * __thiscall
QMultiHash<unsigned_long_long,std::shared_ptr<QGradientCache::CacheInfo_const>>::
emplace_helper<std::shared_ptr<QGradientCache::CacheInfo_const>>
          (iterator *__return_storage_ptr__,void *this,unsigned_long_long *key,
          shared_ptr<const_QGradientCache::CacheInfo> *args)

{
  byte bVar1;
  Entry *pEVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 *puVar8;
  long in_FS_OFFSET;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::
  Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
  ::findOrInsert<unsigned_long_long>((InsertionResult *)local_58,*this,key);
  pEVar2 = (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].entries;
  bVar1 = (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].offsets
          [(uint)local_58._8_8_ & 0x7f];
  if (local_58[0x10] == false) {
    puVar8 = (undefined4 *)operator_new(0x18);
    uVar4 = *(undefined4 *)
             &(args->super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr;
    uVar5 = *(undefined4 *)
             ((long)&(args->
                     super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr + 4);
    uVar6 = *(undefined4 *)
             &(args->super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount._M_pi;
    uVar7 = *(undefined4 *)
             ((long)&(args->
                     super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>
                     )._M_refcount._M_pi + 4);
    (args->super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>).
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *puVar8 = uVar4;
    puVar8[1] = uVar5;
    puVar8[2] = uVar6;
    puVar8[3] = uVar7;
    (args->super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)0x0;
    *(undefined8 *)(puVar8 + 4) = 0;
    *(unsigned_long_long *)pEVar2[bVar1].storage.data = *key;
    *(undefined4 **)(pEVar2[bVar1].storage.data + 8) = puVar8;
  }
  else {
    puVar8 = (undefined4 *)operator_new(0x18);
    uVar4 = *(undefined4 *)
             &(args->super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr;
    uVar5 = *(undefined4 *)
             ((long)&(args->
                     super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr + 4);
    uVar6 = *(undefined4 *)
             &(args->super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount._M_pi;
    uVar7 = *(undefined4 *)
             ((long)&(args->
                     super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>
                     )._M_refcount._M_pi + 4);
    (args->super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>).
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *puVar8 = uVar4;
    puVar8[1] = uVar5;
    puVar8[2] = uVar6;
    puVar8[3] = uVar7;
    (args->super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)0x0;
    uVar3 = *(undefined8 *)(pEVar2[bVar1].storage.data + 8);
    *(undefined4 **)(pEVar2[bVar1].storage.data + 8) = puVar8;
    *(undefined8 *)(puVar8 + 4) = uVar3;
  }
  *(long *)((long)this + 8) = *(long *)((long)this + 8) + 1;
  (__return_storage_ptr__->i).d =
       (Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
        *)local_58._0_8_;
  (__return_storage_ptr__->i).bucket = local_58._8_8_;
  __return_storage_ptr__->e = (Chain **)0x0;
  if ((Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
       *)local_58._0_8_ !=
      (Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
       *)0x0) {
    __return_storage_ptr__->e =
         (Chain **)
         ((*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].entries
          [(*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].offsets
           [(uint)local_58._8_8_ & 0x7f]].storage.data + 8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&...args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->insertMulti(std::forward<Args>(args)...);
        ++m_size;
        return iterator(result.it);
    }